

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_session.hpp
# Opt level: O2

response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
* __thiscall
m2d::savanna::url_session::
send_request<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
          (response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
           *__return_storage_ptr__,url_session *this,
          basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
          *stream,url *url,request<get_yahoo_endpoint> *request)

{
  _Base_ptr p_Var1;
  string_view name;
  flat_buffer buffer;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  string path;
  url new_url;
  request<http::string_body> req;
  response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  local_240;
  request<get_yahoo_endpoint> local_198;
  url local_f0;
  
  savanna::url::to_string_abi_cxx11_(&path,url);
  boost::beast::http::
  message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
  ::message<unsigned_int,void>
            ((message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
              *)&req,get,(string_view)path._0_16_,request->version);
  std::__cxx11::string::string((string *)&new_url,(string *)&url->host_);
  local_240.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void>.size_ =
       (unsigned_long)new_url.scheme_._M_dataplus._M_p;
  local_240.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_ = (node_ptr)new_url.scheme_._M_string_length;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)&req,host,(string_view *)&local_240);
  std::__cxx11::string::~string((string *)&new_url);
  new_url.scheme_._M_string_length = 0xf;
  new_url.scheme_._M_dataplus._M_p = "Boost.Beast/300";
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)&req,user_agent,(string_view *)&new_url);
  for (p_Var1 = (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(request->header_fields)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    new_url.scheme_._M_dataplus._M_p._0_4_ = p_Var1[2]._M_color;
    new_url.scheme_._M_dataplus._M_p._4_4_ = *(undefined4 *)&p_Var1[2].field_0x4;
    new_url.scheme_._M_string_length = (size_type)p_Var1[2]._M_parent;
    boost::beast::http::basic_fields<std::allocator<char>_>::set
              ((basic_fields<std::allocator<char>_> *)&req,*(string_view *)(p_Var1 + 1),
               (string_view *)&new_url);
  }
  boost::beast::http::
  write<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (stream,&req);
  buffer.end_ = (char *)0x0;
  buffer.out_ = (char *)0x0;
  buffer.last_ = (char *)0x0;
  buffer.begin_ = (char *)0x0;
  buffer.in_ = (char *)0x0;
  buffer.max_ = 0x7fffffffffffffff;
  boost::beast::http::
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message(__return_storage_ptr__);
  boost::beast::http::
  read<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::basic_flat_buffer<std::allocator<char>>,false,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,std::allocator<char>>
            (stream,&buffer,__return_storage_ptr__);
  if (((__return_storage_ptr__->
       super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).result_ -
       multiple_choices < 100) && (request->follow_location == true)) {
    name.len_ = 8;
    name.ptr_ = "Location";
    new_url.scheme_._0_16_ =
         boost::beast::http::basic_fields<std::allocator<char>_>::operator[]
                   ((basic_fields<std::allocator<char>_> *)__return_storage_ptr__,name);
    boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
              (&location,&new_url,(allocator<char> *)&local_240);
    std::__cxx11::string::string((string *)&local_3e0,(string *)&location);
    savanna::url::url(&new_url,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    savanna::url::url(&local_f0,&new_url);
    request<get_yahoo_endpoint>::request(&local_198,request);
    send_request<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
              (&local_240,this,stream,&local_f0,&local_198);
    boost::beast::http::
    message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::operator=(__return_storage_ptr__,&local_240);
    boost::beast::http::
    message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(&local_240);
    request<get_yahoo_endpoint>::~request(&local_198);
    savanna::url::~url(&local_f0);
    savanna::url::~url(&new_url);
    std::__cxx11::string::~string((string *)&location);
  }
  boost::beast::basic_flat_buffer<std::allocator<char>_>::~basic_flat_buffer(&buffer);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message(&req);
  std::__cxx11::string::~string((string *)&path);
  return __return_storage_ptr__;
}

Assistant:

http::response<Body> send_request(Stream &stream, savanna::url url, savanna::request<Endpoint> request)
		{
			std::string path = url.to_string();

			http::request<http::string_body> req(request.endpoint.method(), path, request.version);
			req.set(http::field::host, url.host());
			req.set(http::field::user_agent, BOOST_BEAST_VERSION_STRING);

			for (auto h = request.header_fields.begin(); h != request.header_fields.end(); ++h) {
				req.set(h->first, h->second);
			}

			if (request.endpoint.method() != http::verb::get) {
				if (request.endpoint.params()) {
					auto p = *request.endpoint.params();
					req.body() = request.body + savanna::param_str(p);
					req.prepare_payload();
				}
				else {
					req.body() = request.body;
					req.prepare_payload();
				}
			}
			http::write(stream, req);

			beast::flat_buffer buffer;
			http::response<Body> response;
			http::read(stream, buffer, response);

			if ((response.result_int() >= 300) && response.result_int() < 400 && request.follow_location) {
				auto location = response.base()["Location"].to_string();
				auto new_url = savanna::url(location);
				response = send_request<Stream, Body>(stream, std::move(new_url), std::move(request));
			}

			return response;
		}